

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx *cctx,ZSTD_frameParameters fparams)

{
  ulong uVar1;
  
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  uVar1 = (ulong)CONCAT14(fparams._0_8_ >> 0x20 != 0,(uint)(fparams.contentSizeFlag != 0)) &
          (ulong)DAT_002fd4d0;
  (cctx->requestedParams).fParams.contentSizeFlag = (int)uVar1;
  (cctx->requestedParams).fParams.checksumFlag = (int)(uVar1 >> 0x20);
  (cctx->requestedParams).fParams.noDictIDFlag = (uint)(fparams.noDictIDFlag != 0);
  return 0;
}

Assistant:

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx* cctx, ZSTD_frameParameters fparams)
{
    ZSTD_STATIC_ASSERT(sizeof(fparams) == 3 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setFParams");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_contentSizeFlag, fparams.contentSizeFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_checksumFlag, fparams.checksumFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_dictIDFlag, fparams.noDictIDFlag == 0), "");
    return 0;
}